

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftgloadr.c
# Opt level: O0

FT_Error FT_GlyphLoader_CheckPoints(FT_GlyphLoader loader,FT_UInt n_points,FT_UInt n_contours)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  FT_Vector *pFVar4;
  char *pcVar5;
  short *psVar6;
  FT_UInt old_max;
  FT_UInt new_max;
  FT_Bool adjust;
  FT_Outline *current;
  FT_Outline *base;
  FT_Memory pFStack_28;
  FT_Error error;
  FT_Memory memory;
  FT_UInt n_contours_local;
  FT_UInt n_points_local;
  FT_GlyphLoader loader_local;
  
  pFStack_28 = loader->memory;
  base._4_4_ = 0;
  bVar1 = false;
  uVar2 = (int)(loader->base).outline.n_points + (int)(loader->current).outline.n_points + n_points;
  uVar3 = loader->max_points;
  memory._0_4_ = n_contours;
  memory._4_4_ = n_points;
  _n_contours_local = loader;
  if (uVar3 < uVar2) {
    uVar2 = uVar2 + 7 & 0xfffffff8;
    if (0x7fff < uVar2) {
      return 10;
    }
    pFVar4 = (FT_Vector *)
             ft_mem_realloc(pFStack_28,0x10,(ulong)uVar3,(ulong)uVar2,(loader->base).outline.points,
                            (FT_Error *)((long)&base + 4));
    (loader->base).outline.points = pFVar4;
    if (base._4_4_ != 0) goto LAB_001414fa;
    pcVar5 = (char *)ft_mem_realloc(pFStack_28,1,(ulong)uVar3,(ulong)uVar2,
                                    (loader->base).outline.tags,(FT_Error *)((long)&base + 4));
    (loader->base).outline.tags = pcVar5;
    if (base._4_4_ != 0) goto LAB_001414fa;
    if (_n_contours_local->use_extra != '\0') {
      pFVar4 = (FT_Vector *)
               ft_mem_realloc(pFStack_28,0x10,(ulong)(uVar3 << 1),(ulong)(uVar2 << 1),
                              (_n_contours_local->base).extra_points,(FT_Error *)((long)&base + 4));
      (_n_contours_local->base).extra_points = pFVar4;
      if (base._4_4_ != 0) goto LAB_001414fa;
      memmove((_n_contours_local->base).extra_points + uVar2,
              (_n_contours_local->base).extra_points + uVar3,(ulong)uVar3 << 4);
      (_n_contours_local->base).extra_points2 = (_n_contours_local->base).extra_points + uVar2;
    }
    bVar1 = true;
    _n_contours_local->max_points = uVar2;
  }
  uVar3 = (int)(loader->base).outline.n_contours + (int)(loader->current).outline.n_contours +
          (FT_UInt)memory;
  if (_n_contours_local->max_contours < uVar3) {
    uVar3 = uVar3 + 3 & 0xfffffffc;
    if (0x7fff < uVar3) {
      return 10;
    }
    psVar6 = (short *)ft_mem_realloc(pFStack_28,2,(ulong)_n_contours_local->max_contours,
                                     (ulong)uVar3,(loader->base).outline.contours,
                                     (FT_Error *)((long)&base + 4));
    (loader->base).outline.contours = psVar6;
    if (base._4_4_ != 0) goto LAB_001414fa;
    bVar1 = true;
    _n_contours_local->max_contours = uVar3;
  }
  if (bVar1) {
    FT_GlyphLoader_Adjust_Points(_n_contours_local);
  }
LAB_001414fa:
  if (base._4_4_ != 0) {
    FT_GlyphLoader_Reset(_n_contours_local);
  }
  return base._4_4_;
}

Assistant:

FT_BASE_DEF( FT_Error )
  FT_GlyphLoader_CheckPoints( FT_GlyphLoader  loader,
                              FT_UInt         n_points,
                              FT_UInt         n_contours )
  {
    FT_Memory    memory  = loader->memory;
    FT_Error     error   = FT_Err_Ok;
    FT_Outline*  base    = &loader->base.outline;
    FT_Outline*  current = &loader->current.outline;
    FT_Bool      adjust  = 0;

    FT_UInt      new_max, old_max;


    /* check points & tags */
    new_max = (FT_UInt)base->n_points + (FT_UInt)current->n_points +
              n_points;
    old_max = loader->max_points;

    if ( new_max > old_max )
    {
      new_max = FT_PAD_CEIL( new_max, 8 );

      if ( new_max > FT_OUTLINE_POINTS_MAX )
        return FT_THROW( Array_Too_Large );

      if ( FT_RENEW_ARRAY( base->points, old_max, new_max ) ||
           FT_RENEW_ARRAY( base->tags,   old_max, new_max ) )
        goto Exit;

      if ( loader->use_extra )
      {
        if ( FT_RENEW_ARRAY( loader->base.extra_points,
                             old_max * 2, new_max * 2 ) )
          goto Exit;

        FT_ARRAY_MOVE( loader->base.extra_points + new_max,
                       loader->base.extra_points + old_max,
                       old_max );

        loader->base.extra_points2 = loader->base.extra_points + new_max;
      }

      adjust = 1;
      loader->max_points = new_max;
    }

    /* check contours */
    old_max = loader->max_contours;
    new_max = (FT_UInt)base->n_contours + (FT_UInt)current->n_contours +
              n_contours;
    if ( new_max > old_max )
    {
      new_max = FT_PAD_CEIL( new_max, 4 );

      if ( new_max > FT_OUTLINE_CONTOURS_MAX )
        return FT_THROW( Array_Too_Large );

      if ( FT_RENEW_ARRAY( base->contours, old_max, new_max ) )
        goto Exit;

      adjust = 1;
      loader->max_contours = new_max;
    }

    if ( adjust )
      FT_GlyphLoader_Adjust_Points( loader );

  Exit:
    if ( error )
      FT_GlyphLoader_Reset( loader );

    return error;
  }